

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

IntSet * __thiscall OSTEI_VRR_Algorithm_Base::GetIntReq_2q(OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  size_type sVar1;
  key_type *in_RDX;
  map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_RSI;
  key_type *in_RDI;
  key_type *pkVar2;
  key_type *__k;
  
  pkVar2 = in_RDI;
  __k = in_RDX;
  sVar1 = std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::count(in_RSI,in_RDI);
  if (sVar1 == 0) {
    memset(in_RDI,0,0x30);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x11d1b2);
  }
  else {
    std::
    map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::at(in_RSI,__k);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_RDI,
               (set<int,_std::less<int>,_std::allocator<int>_> *)in_RDX);
  }
  return (IntSet *)pkVar2;
}

Assistant:

IntSet OSTEI_VRR_Algorithm_Base::GetIntReq_2q(QAM am) const
{
    if(qamint_2q_.count(am) == 0)
        return IntSet();
    else
        return qamint_2q_.at(am);
}